

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void clear_tracks(ROOM_INDEX_DATA *room)

{
  int i;
  ROOM_INDEX_DATA *room_local;
  
  for (i = 0; i < 3; i = i + 1) {
    room->tracks[i]->prey = (CHAR_DATA *)0x0;
    room->tracks[i]->direction = -1;
    room->tracks[i]->flying = false;
    room->tracks[i]->sneaking = false;
    room->tracks[i]->bleeding = false;
    room->tracks[i]->legs = -1;
  }
  return;
}

Assistant:

void clear_tracks(ROOM_INDEX_DATA *room)
{
	for (auto i = 0; i < MAX_TRACKS - 1; i++)
	{
		room->tracks[i]->prey = nullptr;
		room->tracks[i]->direction = -1;
		room->tracks[i]->flying= false;
		room->tracks[i]->sneaking= false;
		room->tracks[i]->bleeding= false;
		room->tracks[i]->legs = -1;
	}
}